

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TextTrieMap::putImpl(TextTrieMap *this,UnicodeString *key,void *value,UErrorCode *status)

{
  ushort uVar1;
  CharacterNode *pCVar2;
  UnicodeString *this_00;
  undefined8 uVar3;
  int32_t *piVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  UnicodeString foldedKey;
  UnicodeString local_70;
  
  if (this->fNodes == (CharacterNode *)0x0) {
    this->fNodesCapacity = 0x200;
    pCVar2 = (CharacterNode *)uprv_malloc_63(0x2000);
    this->fNodes = pCVar2;
    if (pCVar2 == (CharacterNode *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    pCVar2->fValues = (void *)0x0;
    pCVar2->fCharacter = L'\0';
    pCVar2->fFirstChild = 0;
    pCVar2->fNextSibling = 0;
    pCVar2->fHasValuesVector = '\0';
    pCVar2->fPadding = '\0';
    this->fNodesCount = 1;
  }
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  if (this->fIgnoreCase == '\0') {
    piVar4 = &(key->fUnion).fFields.fLength;
    uVar3 = UnicodeString::getBuffer(key);
    uVar1 = (key->fUnion).fStackFields.fLengthAndFlags;
  }
  else {
    this_00 = UnicodeString::fastCopyFrom(&local_70,key);
    UnicodeString::foldCase(this_00,0);
    piVar4 = &local_70.fUnion.fFields.fLength;
    uVar1 = local_70.fUnion.fStackFields.fLengthAndFlags;
    if ((local_70.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
      uVar3 = local_70.fUnion.fFields.fArray;
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        uVar3 = local_70.fUnion.fStackFields.fBuffer;
      }
    }
    else {
      uVar3 = (char16_t *)0x0;
    }
  }
  if ((short)uVar1 < 0) {
    uVar6 = *piVar4;
  }
  else {
    uVar6 = (int)(short)uVar1 >> 5;
  }
  pCVar2 = this->fNodes;
  uVar5 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pCVar2 = addChildNode(this,pCVar2,*(char16_t *)(uVar3 + uVar5 * 2),status);
  }
  CharacterNode::addValue(pCVar2,value,this->fValueDeleter,status);
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void
TextTrieMap::putImpl(const UnicodeString &key, void *value, UErrorCode &status) {
    if (fNodes == NULL) {
        fNodesCapacity = 512;
        fNodes = (CharacterNode *)uprv_malloc(fNodesCapacity * sizeof(CharacterNode));
        if (fNodes == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        fNodes[0].clear();  // Init root node.
        fNodesCount = 1;
    }

    UnicodeString foldedKey;
    const UChar *keyBuffer;
    int32_t keyLength;
    if (fIgnoreCase) {
        // Ok to use fastCopyFrom() because we discard the copy when we return.
        foldedKey.fastCopyFrom(key).foldCase();
        keyBuffer = foldedKey.getBuffer();
        keyLength = foldedKey.length();
    } else {
        keyBuffer = key.getBuffer();
        keyLength = key.length();
    }

    CharacterNode *node = fNodes;
    int32_t index;
    for (index = 0; index < keyLength; ++index) {
        node = addChildNode(node, keyBuffer[index], status);
    }
    node->addValue(value, fValueDeleter, status);
}